

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::AdamOptimizer::AdamOptimizer(AdamOptimizer *this,AdamOptimizer *from)

{
  void *pvVar1;
  DoubleParameter *pDVar2;
  Int64Parameter *from_00;
  DoubleParameter *pDVar3;
  Int64Parameter *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__AdamOptimizer_0042f5c8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pDVar2 = from->learningrate_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (AdamOptimizer *)&_AdamOptimizer_default_instance_
     ) {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->learningrate_ = pDVar3;
  from_00 = from->minibatchsize_;
  if (from_00 == (Int64Parameter *)0x0 || from == (AdamOptimizer *)&_AdamOptimizer_default_instance_
     ) {
    this_00 = (Int64Parameter *)0x0;
  }
  else {
    this_00 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_00,from_00);
  }
  this->minibatchsize_ = this_00;
  pDVar2 = from->beta1_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (AdamOptimizer *)&_AdamOptimizer_default_instance_
     ) {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->beta1_ = pDVar3;
  pDVar2 = from->beta2_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (AdamOptimizer *)&_AdamOptimizer_default_instance_
     ) {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->beta2_ = pDVar3;
  pDVar2 = from->eps_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (AdamOptimizer *)&_AdamOptimizer_default_instance_
     ) {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->eps_ = pDVar3;
  return;
}

Assistant:

AdamOptimizer::AdamOptimizer(const AdamOptimizer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_learningrate()) {
    learningrate_ = new ::CoreML::Specification::DoubleParameter(*from.learningrate_);
  } else {
    learningrate_ = NULL;
  }
  if (from.has_minibatchsize()) {
    minibatchsize_ = new ::CoreML::Specification::Int64Parameter(*from.minibatchsize_);
  } else {
    minibatchsize_ = NULL;
  }
  if (from.has_beta1()) {
    beta1_ = new ::CoreML::Specification::DoubleParameter(*from.beta1_);
  } else {
    beta1_ = NULL;
  }
  if (from.has_beta2()) {
    beta2_ = new ::CoreML::Specification::DoubleParameter(*from.beta2_);
  } else {
    beta2_ = NULL;
  }
  if (from.has_eps()) {
    eps_ = new ::CoreML::Specification::DoubleParameter(*from.eps_);
  } else {
    eps_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.AdamOptimizer)
}